

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O0

DWORD * __thiscall
MIDISong2::SendCommand
          (MIDISong2 *this,DWORD *events,TrackInfo *track,DWORD delay,ptrdiff_t room,
          bool *sysex_noroom)

{
  BYTE BVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  DWORD DVar5;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  DWORD *local_68;
  BYTE *msg;
  int loopcount_1;
  int loopcount;
  size_t start_p;
  byte local_47;
  byte local_46;
  byte local_45;
  int i;
  BYTE data2;
  BYTE data1;
  BYTE event;
  DWORD len;
  bool *sysex_noroom_local;
  ptrdiff_t room_local;
  DWORD delay_local;
  TrackInfo *track_local;
  DWORD *events_local;
  MIDISong2 *this_local;
  
  local_46 = 0;
  local_47 = 0;
  *sysex_noroom = false;
  sVar2 = track->TrackP;
  this_local = (MIDISong2 *)events;
  if (track->TrackP < track->MaxTrackP) {
    sVar3 = track->TrackP;
    track->TrackP = sVar3 + 1;
    local_45 = track->TrackBegin[sVar3];
    if (track->TrackP < track->MaxTrackP) {
      *events = delay;
      events[1] = 0;
      events[2] = 0x2000000;
      if (((local_45 == 0xf0) || (local_45 == 0xff)) || (local_45 == 0xf7)) {
        if ((local_45 == 0xf0) || (local_45 == 0xf7)) {
          DVar5 = TrackInfo::ReadVarLen(track);
          if ((DVar5 < 0x5f4) && ((this->super_MIDIStreamer).DeviceType != MDEV_SNDSYS)) {
            if ((ulong)(room << 2) <= (ulong)(DVar5 + 0xc)) {
              track->TrackP = sVar2;
              *sysex_noroom = true;
              return events;
            }
            local_68 = events + 3;
            if (local_45 == 0xf0) {
              events[2] = DVar5 + 1 | 0x80000000;
              *(undefined1 *)local_68 = 0xf0;
              local_68 = (DWORD *)((long)events + 0xd);
            }
            else {
              events[2] = DVar5 | 0x80000000;
            }
            memcpy(local_68,track->TrackBegin + track->TrackP,(ulong)DVar5);
            local_68 = (DWORD *)((long)local_68 + (ulong)DVar5);
            while (((ulong)local_68 & 3) != 0) {
              *(undefined1 *)local_68 = 0;
              local_68 = (DWORD *)((long)local_68 + 1);
            }
            track->TrackP = (ulong)DVar5 + track->TrackP;
          }
          else {
            track->TrackP = (ulong)DVar5 + track->TrackP;
          }
        }
        else if (local_45 == 0xff) {
          sVar2 = track->TrackP;
          track->TrackP = sVar2 + 1;
          BVar1 = track->TrackBegin[sVar2];
          if (track->MaxTrackP <= track->TrackP) {
            track->Finished = true;
            return events;
          }
          DVar5 = TrackInfo::ReadVarLen(track);
          if (track->MaxTrackP <= track->TrackP) {
            track->Finished = true;
            return events;
          }
          if (track->MaxTrackP < track->TrackP + (ulong)DVar5) {
            track->Finished = true;
          }
          else {
            if (BVar1 == '/') {
              track->Finished = true;
            }
            else if (BVar1 == 'Q') {
              (this->super_MIDIStreamer).Tempo =
                   (uint)track->TrackBegin[track->TrackP] << 0x10 |
                   (uint)track->TrackBegin[track->TrackP + 1] << 8 |
                   (uint)track->TrackBegin[track->TrackP + 2];
              *events = delay;
              events[1] = 0;
              events[2] = (this->super_MIDIStreamer).Tempo | 0x1000000;
            }
            track->TrackP = (ulong)DVar5 + track->TrackP;
            if (track->TrackP == track->MaxTrackP) {
              track->Finished = true;
            }
          }
        }
      }
      else {
        if ((local_45 & 0xf0) == 0xf0) {
          if ('\0' < MIDI_CommonLengths[(int)(local_45 & 0xf)]) {
            sVar2 = track->TrackP;
            track->TrackP = sVar2 + 1;
            local_46 = track->TrackBegin[sVar2];
            if ('\x01' < MIDI_CommonLengths[(int)(local_45 & 0xf)]) {
              sVar2 = track->TrackP;
              track->TrackP = sVar2 + 1;
              local_47 = track->TrackBegin[sVar2];
            }
          }
        }
        else if ((local_45 & 0x80) == 0) {
          local_46 = local_45;
          local_45 = track->RunningStatus;
        }
        else {
          track->RunningStatus = local_45;
          sVar2 = track->TrackP;
          track->TrackP = sVar2 + 1;
          local_46 = track->TrackBegin[sVar2];
        }
        if (track->MaxTrackP <= track->TrackP) {
          track->Finished = true;
          return events;
        }
        if (MIDI_EventLengths[(int)(local_45 & 0x70) >> 4] == '\x02') {
          sVar2 = track->TrackP;
          track->TrackP = sVar2 + 1;
          local_47 = track->TrackBegin[sVar2];
        }
        if ((local_45 & 0x70) == 0x30) {
          if (local_46 == 7) {
            if ((track->EVolume & 1U) == 0) {
              iVar4 = MIDIStreamer::VolumeControllerChange
                                (&this->super_MIDIStreamer,local_45 & 0xf,(uint)local_47);
              local_47 = (byte)iVar4;
            }
            else {
              local_45 = 0xff;
            }
          }
          else if (local_46 == 0x27) {
            if ((track->EVolume & 1U) != 0) {
              local_45 = 0xff;
            }
          }
          else if (local_46 == 0x6e) {
            if (track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) {
              if (local_47 == 0x7f) {
                track->Designation = 0xffff;
                track->Designated = true;
              }
              else if (local_47 < 10) {
                track->Designation = track->Designation | (ushort)(1 << (local_47 & 0x1f));
                track->Designated = true;
              }
              local_45 = 0xff;
            }
          }
          else if (local_46 == 0x6f) {
            if (track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) {
              if (((track->Designated & 1U) != 0) && (local_47 < 10)) {
                track->Designation =
                     track->Designation & ((ushort)(1 << (local_47 & 0x1f)) ^ 0xffff);
              }
              local_45 = 0xff;
            }
          }
          else if (local_46 == 0x70) {
            if ((track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) ||
               ((track->EProgramChange & 1U) != 0)) {
              track->EProgramChange = true;
              local_45 = local_45 & 0xf | 0xc0;
              local_46 = local_47;
              local_47 = 0;
            }
          }
          else if (local_46 == 0x71) {
            if ((track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) ||
               ((track->EVolume & 1U) != 0)) {
              track->EVolume = true;
              local_46 = 7;
              iVar4 = MIDIStreamer::VolumeControllerChange
                                (&this->super_MIDIStreamer,local_45 & 0xf,(uint)local_47);
              local_47 = (byte)iVar4;
            }
          }
          else if (local_46 == 0x74) {
            if (local_47 == 0) {
              local_7c = 0;
            }
            else {
              local_7c = local_47 + 1;
            }
            local_80 = MIDIStreamer::ClampLoopCount(&this->super_MIDIStreamer,local_7c);
            if (local_80 != 1) {
              track->LoopBegin = track->TrackP;
              track->LoopDelay = 0;
              if (local_80 == 0) {
                local_80 = 0;
              }
              else {
                local_80 = local_80 + -1;
              }
              track->LoopCount = local_80;
              track->LoopFinished = (bool)(track->Finished & 1);
            }
            local_45 = 0xff;
          }
          else if (local_46 == 0x75) {
            if ((-1 < track->LoopCount) && (local_47 == 0x7f)) {
              if ((track->LoopCount == 0) &&
                 (((this->super_MIDIStreamer).super_MusInfo.m_Looping & 1U) == 0)) {
                track->Finished = true;
              }
              else {
                if ((0 < track->LoopCount) &&
                   (iVar4 = track->LoopCount + -1, track->LoopCount = iVar4, iVar4 == 0)) {
                  track->LoopCount = -1;
                }
                track->TrackP = track->LoopBegin;
                track->Delay = track->LoopDelay;
                track->Finished = (bool)(track->LoopFinished & 1);
              }
            }
            local_45 = 0xff;
          }
          else if (local_46 == 0x76) {
            if (local_47 == 0) {
              local_84 = 0;
            }
            else {
              local_84 = local_47 + 1;
            }
            iVar4 = MIDIStreamer::ClampLoopCount(&this->super_MIDIStreamer,local_84);
            if (iVar4 != 1) {
              for (start_p._4_4_ = 0; start_p._4_4_ < this->NumTracks;
                  start_p._4_4_ = start_p._4_4_ + 1) {
                this->Tracks[start_p._4_4_].LoopBegin = this->Tracks[start_p._4_4_].TrackP;
                this->Tracks[start_p._4_4_].LoopDelay = this->Tracks[start_p._4_4_].Delay;
                if (iVar4 == 0) {
                  local_88 = 0;
                }
                else {
                  local_88 = iVar4 + -1;
                }
                this->Tracks[start_p._4_4_].LoopCount = local_88;
                this->Tracks[start_p._4_4_].LoopFinished =
                     (bool)(this->Tracks[start_p._4_4_].Finished & 1);
              }
            }
            local_45 = 0xff;
          }
          else if (local_46 == 0x77) {
            if (local_47 == 0x7f) {
              for (start_p._4_4_ = 0; start_p._4_4_ < this->NumTracks;
                  start_p._4_4_ = start_p._4_4_ + 1) {
                if (-1 < this->Tracks[start_p._4_4_].LoopCount) {
                  if ((this->Tracks[start_p._4_4_].LoopCount == 0) &&
                     (((this->super_MIDIStreamer).super_MusInfo.m_Looping & 1U) == 0)) {
                    this->Tracks[start_p._4_4_].Finished = true;
                  }
                  else {
                    if ((0 < this->Tracks[start_p._4_4_].LoopCount) &&
                       (iVar4 = this->Tracks[start_p._4_4_].LoopCount + -1,
                       this->Tracks[start_p._4_4_].LoopCount = iVar4, iVar4 == 0)) {
                      this->Tracks[start_p._4_4_].LoopCount = -1;
                    }
                    this->Tracks[start_p._4_4_].TrackP = this->Tracks[start_p._4_4_].LoopBegin;
                    this->Tracks[start_p._4_4_].Delay = this->Tracks[start_p._4_4_].LoopDelay;
                    this->Tracks[start_p._4_4_].Finished =
                         (bool)(this->Tracks[start_p._4_4_].LoopFinished & 1);
                  }
                }
              }
            }
            local_45 = 0xff;
          }
        }
        else if (((local_45 & 0x70) == 0x40) && ((track->EProgramChange & 1U) != 0)) {
          local_45 = 0xff;
        }
        if ((local_45 != 0xff) &&
           (((track->Designated & 1U) == 0 || ((track->Designation & this->DesignationMask) != 0))))
        {
          events[2] = (uint)CONCAT12(local_47,CONCAT11(local_46,local_45));
        }
      }
      if ((track->Finished & 1U) == 0) {
        DVar5 = TrackInfo::ReadVarLen(track);
        track->Delay = DVar5;
      }
      if ((*events != 0) || (track_local = (TrackInfo *)events, events[2] >> 0x18 != 2)) {
        if (events[2] >> 0x18 == 0x80) {
          track_local = (TrackInfo *)(events + (((events[2] & 0xffffff) + 3 >> 2) + 3));
        }
        else {
          track_local = (TrackInfo *)(events + 3);
        }
      }
      this_local = (MIDISong2 *)track_local;
    }
    else {
      track->Finished = true;
    }
  }
  else {
    track->Finished = true;
  }
  return (DWORD *)this_local;
}

Assistant:

DWORD *MIDISong2::SendCommand (DWORD *events, TrackInfo *track, DWORD delay, ptrdiff_t room, bool &sysex_noroom)
{
	DWORD len;
	BYTE event, data1 = 0, data2 = 0;
	int i;

	sysex_noroom = false;
	size_t start_p = track->TrackP;

	CHECK_FINISHED
	event = track->TrackBegin[track->TrackP++];
	CHECK_FINISHED

	// The actual event type will be filled in below.
	events[0] = delay;
	events[1] = 0;
	events[2] = MEVT_NOP << 24;

	if (event != MIDI_SYSEX && event != MIDI_META && event != MIDI_SYSEXEND)
	{
		// Normal short message
		if ((event & 0xF0) == 0xF0)
		{
			if (MIDI_CommonLengths[event & 15] > 0)
			{
				data1 = track->TrackBegin[track->TrackP++];
				if (MIDI_CommonLengths[event & 15] > 1)
				{
					data2 = track->TrackBegin[track->TrackP++];
				}
			}
		}
		else if ((event & 0x80) == 0)
		{
			data1 = event;
			event = track->RunningStatus;
		}
		else
		{
			track->RunningStatus = event;
			data1 = track->TrackBegin[track->TrackP++];
		}

		CHECK_FINISHED

		if (MIDI_EventLengths[(event&0x70)>>4] == 2)
		{
			data2 = track->TrackBegin[track->TrackP++];
		}

		switch (event & 0x70)
		{
		case MIDI_PRGMCHANGE & 0x70:
			if (track->EProgramChange)
			{
				event = MIDI_META;
			}
			break;

		case MIDI_CTRLCHANGE & 0x70:
			switch (data1)
			{
			case 7:		// Channel volume
				if (track->EVolume)
				{ // Tracks that use EMIDI volume ignore normal volume changes.
					event = MIDI_META;
				}
				else
				{
					data2 = VolumeControllerChange(event & 15, data2);
				}
				break;

			case 7+32:	// Channel volume (LSB)
				if (track->EVolume)
				{
					event = MIDI_META;
				}
				// It should be safe to pass this straight through to the
				// MIDI device, since it's a very fine amount.
				break;

			case 110:	// EMIDI Track Designation - InitBeat only
				// Instruments 4, 5, 6, and 7 are all FM synth.
				// The rest are all wavetable.
				if (track->PlayedTime < (DWORD)Division)
				{
					if (data2 == 127)
					{
						track->Designation = ~0;
						track->Designated = true;
					}
					else if (data2 <= 9)
					{
						track->Designation |= 1 << data2;
						track->Designated = true;
					}
					event = MIDI_META;
				}
				break;

			case 111:	// EMIDI Track Exclusion - InitBeat only
				if (track->PlayedTime < (DWORD)Division)
				{
					if (track->Designated && data2 <= 9)
					{
						track->Designation &= ~(1 << data2);
					}
					event = MIDI_META;
				}
				break;

			case 112:	// EMIDI Program Change
				// Ignored unless it also appears in the InitBeat
				if (track->PlayedTime < (DWORD)Division || track->EProgramChange)
				{
					track->EProgramChange = true;
					event = 0xC0 | (event & 0x0F);
					data1 = data2;
					data2 = 0;
				}
				break;

			case 113:	// EMIDI Volume
				// Ignored unless it also appears in the InitBeat
				if (track->PlayedTime < (DWORD)Division || track->EVolume)
				{
					track->EVolume = true;
					data1 = 7;
					data2 = VolumeControllerChange(event & 15, data2);
				}
				break;

			case 116:	// EMIDI Loop Begin
				{
					// We convert the loop count to XMIDI conventions before clamping.
					// Then we convert it back to EMIDI conventions after clamping.
					// (XMIDI can create "loops" that don't loop. EMIDI cannot.)
					int loopcount = ClampLoopCount(data2 == 0 ? 0 : data2 + 1);
					if (loopcount != 1)
					{
						track->LoopBegin = track->TrackP;
						track->LoopDelay = 0;
						track->LoopCount = loopcount == 0 ? 0 : loopcount - 1;
						track->LoopFinished = track->Finished;
					}
				}
				event = MIDI_META;
				break;

			case 117:	// EMIDI Loop End
				if (track->LoopCount >= 0 && data2 == 127)
				{
					if (track->LoopCount == 0 && !m_Looping)
					{
						track->Finished = true;
					}
					else
					{
						if (track->LoopCount > 0 && --track->LoopCount == 0)
						{
							track->LoopCount = -1;
						}
						track->TrackP = track->LoopBegin;
						track->Delay = track->LoopDelay;
						track->Finished = track->LoopFinished;
					}
				}
				event = MIDI_META;
				break;

			case 118:	// EMIDI Global Loop Begin
				{
					int loopcount = ClampLoopCount(data2 == 0 ? 0 : data2 + 1);
					if (loopcount != 1)
					{
						for (i = 0; i < NumTracks; ++i)
						{
							Tracks[i].LoopBegin = Tracks[i].TrackP;
							Tracks[i].LoopDelay = Tracks[i].Delay;
							Tracks[i].LoopCount = loopcount == 0 ? 0 : loopcount - 1;
							Tracks[i].LoopFinished = Tracks[i].Finished;
						}
					}
				}
				event = MIDI_META;
				break;

			case 119:	// EMIDI Global Loop End
				if (data2 == 127)
				{
					for (i = 0; i < NumTracks; ++i)
					{
						if (Tracks[i].LoopCount >= 0)
						{
							if (Tracks[i].LoopCount == 0 && !m_Looping)
							{
								Tracks[i].Finished = true;
							}
							else
							{
								if (Tracks[i].LoopCount > 0 && --Tracks[i].LoopCount == 0)
								{
									Tracks[i].LoopCount = -1;
								}
								Tracks[i].TrackP = Tracks[i].LoopBegin;
								Tracks[i].Delay = Tracks[i].LoopDelay;
								Tracks[i].Finished = Tracks[i].LoopFinished;
							}
						}
					}
				}
				event = MIDI_META;
				break;
			}
		}
		if (event != MIDI_META && (!track->Designated || (track->Designation & DesignationMask)))
		{
			events[2] = event | (data1<<8) | (data2<<16);
		}
	}
	else
	{
		// SysEx events could potentially not have enough room in the buffer...
		if (event == MIDI_SYSEX || event == MIDI_SYSEXEND)
		{
			len = track->ReadVarLen();
			if (len >= (MAX_EVENTS-1)*3*4 || DeviceType == MDEV_SNDSYS)
			{ // This message will never fit. Throw it away.
				track->TrackP += len;
			}
			else if (len + 12 >= (size_t)room * 4)
			{ // Not enough room left in this buffer. Backup and wait for the next one.
				track->TrackP = start_p;
				sysex_noroom = true;
				return events;
			}
			else
			{
				BYTE *msg = (BYTE *)&events[3];
				if (event == MIDI_SYSEX)
				{ // Need to add the SysEx marker to the message.
					events[2] = (MEVT_LONGMSG << 24) | (len + 1);
					*msg++ = MIDI_SYSEX;
				}
				else
				{
					events[2] = (MEVT_LONGMSG << 24) | len;
				}
				memcpy(msg, &track->TrackBegin[track->TrackP], len);
				msg += len;
				// Must pad with 0
				while ((size_t)msg & 3)
				{
					*msg++ = 0;
				}
				track->TrackP += len;
			}
		}
		else if (event == MIDI_META)
		{
			// It's a meta-event
			event = track->TrackBegin[track->TrackP++];
			CHECK_FINISHED
			len = track->ReadVarLen ();
			CHECK_FINISHED

			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					Tempo =
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2]);
					events[0] = delay;
					events[1] = 0;
					events[2] = (MEVT_TEMPO << 24) | Tempo;
					break;
				}
				track->TrackP += len;
				if (track->TrackP == track->MaxTrackP)
				{
					track->Finished = true;
				}
			}
			else
			{
				track->Finished = true;
			}
		}
	}